

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall
smf::MidiMessage::makeTemperamentMeantone
          (MidiMessage *this,double fraction,int referencePitchClass,int channelMask)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer pdVar4;
  double dVar5;
  double dVar6;
  vector<double,_std::allocator<double>_> local_40;
  
  pdVar4 = (pointer)operator_new(0x60);
  local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar4 + 0xc;
  local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar4;
  local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  dVar5 = pow(1.0125,-fraction);
  dVar6 = log2(dVar5 * 1.5);
  dVar6 = dVar6 * 1200.0;
  *pdVar4 = 0.0;
  pdVar4[7] = dVar6 + -700.0;
  dVar5 = dVar6 * 2.0 + -1400.0;
  auVar1._8_4_ = SUB84(dVar5,0);
  auVar1._0_8_ = dVar6 * -5.0 + 3500.0;
  auVar1._12_4_ = (int)((ulong)dVar5 >> 0x20);
  *(undefined1 (*) [16])(pdVar4 + 1) = auVar1;
  dVar5 = dVar6 * 3.0 + -2100.0;
  auVar2._8_4_ = SUB84(dVar5,0);
  auVar2._0_8_ = dVar6 * -4.0 + 2800.0;
  auVar2._12_4_ = (int)((ulong)dVar5 >> 0x20);
  *(undefined1 (*) [16])(pdVar4 + 8) = auVar2;
  pdVar4[3] = dVar6 * -3.0 + 2100.0;
  pdVar4[4] = dVar6 * 4.0 + -2800.0;
  dVar5 = dVar6 * 5.0 + -3500.0;
  auVar3._8_4_ = SUB84(dVar5,0);
  auVar3._0_8_ = dVar6 * -2.0 + 1400.0;
  auVar3._12_4_ = (int)((ulong)dVar5 >> 0x20);
  *(undefined1 (*) [16])(pdVar4 + 10) = auVar3;
  pdVar4[5] = dVar6 * -1.0 + 700.0;
  pdVar4[6] = dVar6 * 6.0 + -4200.0;
  makeMts9_TemperamentByCentsDeviationFromET(this,&local_40,referencePitchClass,channelMask);
  operator_delete(pdVar4);
  return;
}

Assistant:

void MidiMessage::makeTemperamentMeantone(double fraction, int referencePitchClass, int channelMask) {
	std::vector<double> temperament(12);
	double x = 1200.0 * log2((3.0/2.0)*pow(81.0/80.0, -fraction));
	temperament[1]  = x * -5 + 3500; //  17.107 cents (for fraction = 0.25)
	temperament[8]  = x * -4 + 2800; //  13.686 cents (for fraction = 0.25)
	temperament[3]  = x * -3 + 2100; //  10.265 cents (for fraction = 0.25)
	temperament[10] = x * -2 + 1400; //   6.843 cents (for fraction = 0.25)
	temperament[5]  = x * -1 + 700;  //   3.422 cents (for fraction = 0.25)
	temperament[0]  = 0.0;           //   0     cents
	temperament[7]  = x *  1 - 700;  //  -3.422 cents (for fraction = 0.25)
	temperament[2]  = x *  2 - 1400; //  -6.843 cents (for fraction = 0.25)
	temperament[9]  = x *  3 - 2100; // -10.265 cents (for fraction = 0.25)
	temperament[4]  = x *  4 - 2800; // -13.686 cents (for fraction = 0.25)
	temperament[11] = x *  5 - 3500; // -17.107 cents (for fraction = 0.25)
	temperament[6]  = x *  6 - 4200; // -20.529 cents (for fraction = 0.25)
	this->makeMts9_TemperamentByCentsDeviationFromET(temperament, referencePitchClass, channelMask);
}